

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dcb.c
# Opt level: O3

int envy_bios_parse_dcb(envy_bios *bios)

{
  ushort uVar1;
  uint8_t *puVar2;
  envy_bios_dcb_entry *peVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  envy_bios_dcb_entry *peVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  char *__format;
  byte bVar21;
  uint8_t uVar22;
  byte bVar23;
  uint uVar24;
  uint uVar25;
  bool bVar26;
  uint8_t dev_rec [7];
  byte local_4a [10];
  uint local_40;
  uint local_3c;
  envy_bios_dcb *local_38;
  
  uVar1 = (bios->dcb).offset;
  uVar19 = (ulong)uVar1;
  if (uVar1 == 0) {
    return 0;
  }
  uVar6 = bios->length;
  if (uVar6 <= uVar1) {
    (bios->dcb).version = '\0';
    fprintf(_stderr,"requested OOB u8 at 0x%04x\n",(ulong)(uint)uVar1);
    return -0xe;
  }
  puVar2 = bios->data;
  bVar4 = puVar2[(uint)uVar1];
  (bios->dcb).version = bVar4;
  switch(bVar4) {
  case 0x10:
  case 0x11:
    (bios->dcb).rlen = '\0';
    (bios->dcb).version = '\0';
    (bios->dcb).hlen = '\0';
    bios->odcb_offset = (uint)uVar1;
    (bios->dcb).offset = 0;
    return 0;
  case 0x12:
    (bios->dcb).hlen = '\x04';
    (bios->dcb).entriesnum = '\x10';
    (bios->dcb).rlen = '\b';
    if ((uint)(uVar19 + 1) < uVar6) {
      bVar4 = puVar2[uVar19 + 1];
      uVar25 = 0;
    }
    else {
      bVar4 = 0;
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      uVar19 = (ulong)(bios->dcb).offset;
      uVar6 = bios->length;
      uVar25 = 0xfffffff2;
    }
    uVar5 = (uint)uVar19;
    if ((uint)(uVar19 + 3) < uVar6) {
      (bios->i2c).offset = CONCAT11(bios->data[uVar19 + 3],bios->data[uVar19 + 2]);
      uVar24 = 0;
    }
    else {
      (bios->i2c).offset = 0;
      fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
      uVar5 = (uint)(bios->dcb).offset;
      uVar24 = 0xfffffff2;
    }
    uVar24 = uVar24 | uVar25;
    (bios->i2c).def[0] = bVar4 & 0xf;
    (bios->i2c).def[1] = bVar4 >> 4;
    bios->odcb_offset = uVar5 - 0x80;
    envy_bios_block(bios,uVar5 - 0x80,0x80,"ODCB",-1);
    uVar25 = 8;
    break;
  case 0x13:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
    goto switchD_00255a8e_caseD_13;
  case 0x14:
  case 0x15:
    (bios->dcb).hlen = '\x04';
    (bios->dcb).entriesnum = '\x10';
    (bios->dcb).rlen = '\n';
    if ((uint)(uVar19 + 1) < uVar6) {
      bVar4 = puVar2[uVar19 + 1];
      uVar25 = 0;
    }
    else {
      bVar4 = 0;
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      uVar19 = (ulong)(bios->dcb).offset;
      uVar6 = bios->length;
      uVar25 = 0xfffffff2;
    }
    if ((uint)(uVar19 + 3) < uVar6) {
      (bios->i2c).offset = CONCAT11(bios->data[uVar19 + 3],bios->data[uVar19 + 2]);
      uVar24 = 0;
    }
    else {
      (bios->i2c).offset = 0;
      fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
      uVar24 = 0xfffffff2;
    }
    uVar24 = uVar24 | uVar25;
    (bios->i2c).def[0] = bVar4 & 0xf;
    (bios->i2c).def[1] = bVar4 >> 4;
    uVar25 = 10;
    break;
  case 0x20:
  case 0x21:
  case 0x22:
    (bios->dcb).hlen = '\b';
    (bios->dcb).entriesnum = '\x10';
    (bios->dcb).rlen = '\b';
    if ((uint)(uVar19 + 1) < uVar6) {
      bVar4 = puVar2[uVar19 + 1];
      uVar25 = 0;
    }
    else {
      bVar4 = 0;
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      uVar19 = (ulong)(bios->dcb).offset;
      uVar6 = bios->length;
      uVar25 = 0xfffffff2;
    }
    uVar5 = (uint)uVar19;
    if ((uint)(uVar19 + 3) < uVar6) {
      (bios->i2c).offset = CONCAT11(bios->data[uVar19 + 3],bios->data[uVar19 + 2]);
      uVar24 = 0;
    }
    else {
      (bios->i2c).offset = 0;
      fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
      uVar5 = (uint)(bios->dcb).offset;
      uVar6 = bios->length;
      uVar24 = 0xfffffff2;
    }
    uVar19 = (ulong)uVar5;
    if ((uint)(uVar19 + 7) < uVar6) {
      puVar2 = bios->data;
      if (CONCAT13(puVar2[uVar19 + 7],
                   CONCAT12(puVar2[uVar19 + 6],*(undefined2 *)(puVar2 + uVar19 + 4))) != 0x4edcbdcb)
      goto LAB_00256524;
      uVar24 = uVar24 | uVar25;
      (bios->i2c).def[0] = bVar4 & 0xf;
      (bios->i2c).def[1] = bVar4 >> 4;
      uVar6 = 8;
      uVar25 = 8;
      goto LAB_00255f1d;
    }
    fprintf(_stderr,"requested OOB u32 at 0x%04x\n");
LAB_00256524:
    envy_bios_parse_dcb_cold_2();
    goto LAB_00256546;
  default:
    if ((bVar4 - 0x30 < 0x12) && ((0x30001U >> (bVar4 - 0x30 & 0x1f) & 1) != 0)) {
      if ((uint)(uVar19 + 1) < uVar6) {
        (bios->dcb).hlen = puVar2[uVar19 + 1];
        uVar25 = 0;
      }
      else {
        (bios->dcb).hlen = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        uVar19 = (ulong)(bios->dcb).offset;
        uVar6 = bios->length;
        uVar25 = 0xfffffff2;
      }
      if ((uint)(uVar19 + 2) < uVar6) {
        (bios->dcb).entriesnum = bios->data[uVar19 + 2];
        uVar5 = 0;
      }
      else {
        (bios->dcb).entriesnum = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        uVar19 = (ulong)(bios->dcb).offset;
        uVar6 = bios->length;
        uVar5 = 0xfffffff2;
      }
      if ((uint)(uVar19 + 3) < uVar6) {
        (bios->dcb).rlen = bios->data[uVar19 + 3];
        uVar10 = 0;
      }
      else {
        (bios->dcb).rlen = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        uVar19 = (ulong)(bios->dcb).offset;
        uVar6 = bios->length;
        uVar10 = 0xfffffff2;
      }
      if ((uint)(uVar19 + 5) < uVar6) {
        (bios->i2c).offset = CONCAT11(bios->data[uVar19 + 5],bios->data[uVar19 + 4]);
        uVar11 = 0;
      }
      else {
        (bios->i2c).offset = 0;
        fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
        uVar19 = (ulong)(bios->dcb).offset;
        uVar6 = bios->length;
        uVar11 = 0xfffffff2;
      }
      if ((uint)(uVar19 + 9) < uVar6) {
        puVar2 = bios->data;
        bVar26 = CONCAT13(puVar2[uVar19 + 9],
                          CONCAT12(puVar2[uVar19 + 8],*(undefined2 *)(puVar2 + uVar19 + 6))) ==
                 0x4edcbdcb;
        uVar12 = 0;
      }
      else {
        bVar26 = false;
        fprintf(_stderr,"requested OOB u32 at 0x%04x\n");
        uVar19 = (ulong)(bios->dcb).offset;
        uVar6 = bios->length;
        uVar12 = 0xfffffff2;
      }
      if ((uint)(uVar19 + 0xb) < uVar6) {
        (bios->gpio).offset = CONCAT11(bios->data[uVar19 + 0xb],bios->data[uVar19 + 10]);
        uVar13 = 0;
      }
      else {
        (bios->gpio).offset = 0;
        fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
        uVar19 = (ulong)(bios->dcb).offset;
        uVar6 = bios->length;
        uVar13 = 0xfffffff2;
      }
      if ((uint)(uVar19 + 0xd) < uVar6) {
        (bios->inputdev).offset = CONCAT11(bios->data[uVar19 + 0xd],bios->data[uVar19 + 0xc]);
        uVar14 = 0;
      }
      else {
        (bios->inputdev).offset = 0;
        fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
        uVar19 = (ulong)(bios->dcb).offset;
        uVar6 = bios->length;
        uVar14 = 0xfffffff2;
      }
      if ((uint)(uVar19 + 0xf) < uVar6) {
        (bios->cinema).offset = CONCAT11(bios->data[uVar19 + 0xf],bios->data[uVar19 + 0xe]);
        uVar15 = 0;
      }
      else {
        (bios->cinema).offset = 0;
        fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
        uVar19 = (ulong)(bios->dcb).offset;
        uVar6 = bios->length;
        uVar15 = 0xfffffff2;
      }
      if ((uint)(uVar19 + 0x11) < uVar6) {
        (bios->spreadspectrum).offset =
             CONCAT11(bios->data[uVar19 + 0x11],bios->data[uVar19 + 0x10]);
        uVar16 = 0;
      }
      else {
        (bios->spreadspectrum).offset = 0;
        fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
        uVar19 = (ulong)(bios->dcb).offset;
        uVar6 = bios->length;
        uVar16 = 0xfffffff2;
      }
      if ((uint)(uVar19 + 0x13) < uVar6) {
        (bios->extdev).offset = CONCAT11(bios->data[uVar19 + 0x13],bios->data[uVar19 + 0x12]);
        uVar17 = 0;
      }
      else {
        (bios->extdev).offset = 0;
        fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
        uVar19 = (ulong)(bios->dcb).offset;
        uVar6 = bios->length;
        uVar17 = 0xfffffff2;
      }
      uVar24 = (uint)uVar19;
      if ((uint)(uVar19 + 0x15) < uVar6) {
        (bios->conn).offset = CONCAT11(bios->data[uVar19 + 0x15],bios->data[uVar19 + 0x14]);
        uVar18 = 0;
      }
      else {
        (bios->conn).offset = 0;
        fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
        uVar24 = (uint)(bios->dcb).offset;
        uVar6 = bios->length;
        uVar18 = 0xfffffff2;
      }
      if ((uint)((ulong)uVar24 + 0x16) < uVar6) {
        (bios->dcb).unk16 = bios->data[(ulong)uVar24 + 0x16];
        uVar24 = 0;
      }
      else {
        (bios->dcb).unk16 = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        uVar24 = 0xfffffff2;
      }
      uVar24 = uVar5 | uVar25 | uVar10 | uVar11 | uVar12 | uVar13 | uVar14 | uVar15 | uVar16 |
               uVar17 | uVar18 | uVar24;
      bVar4 = (bios->dcb).hlen;
      uVar6 = 0x17;
      if (0x18 < bVar4) {
        uVar19 = (ulong)(bios->dcb).offset;
        lVar9 = uVar19 + 0x18;
        if ((uint)lVar9 < bios->length) {
          (bios->hdtvtt).offset = CONCAT11(bios->data[lVar9],bios->data[uVar19 + 0x17]);
          uVar6 = 0;
        }
        else {
          (bios->hdtvtt).offset = 0;
          fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
          bVar4 = (bios->dcb).hlen;
          uVar6 = 0xfffffff2;
        }
        uVar24 = uVar24 | uVar6;
        uVar6 = 0x19;
        if (0x1a < bVar4) {
          uVar19 = (ulong)(bios->dcb).offset;
          lVar9 = uVar19 + 0x1a;
          if ((uint)lVar9 < bios->length) {
            (bios->mux).offset = CONCAT11(bios->data[lVar9],bios->data[uVar19 + 0x19]);
            uVar6 = 0;
          }
          else {
            (bios->mux).offset = 0;
            fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
            uVar6 = 0xfffffff2;
          }
          uVar24 = uVar24 | uVar6;
          uVar6 = 0x1b;
        }
      }
      uVar25 = 8;
      if (bVar26) goto LAB_00255f1d;
      envy_bios_parse_dcb_cold_1();
      goto LAB_00256546;
    }
    goto switchD_00255a8e_caseD_13;
  }
  uVar6 = 4;
LAB_00255f1d:
  envy_bios_block(bios,(uint)(bios->dcb).offset,
                  (uint)(bios->dcb).entriesnum * (uint)(bios->dcb).rlen + (uint)(bios->dcb).hlen,
                  "DCB",-1);
  if ((byte)((bios->dcb).version - 0x14) < 0x1c) {
    local_38 = &bios->dcb;
    lVar9 = 0;
    local_40 = uVar6;
    local_3c = uVar25;
    do {
      uVar19 = ((ulong)(bios->dcb).offset + lVar9) - 7;
      if ((uint)uVar19 < bios->length) {
        bVar4 = bios->data[uVar19 & 0xffffffff];
        uVar6 = 0;
      }
      else {
        bVar4 = 0;
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        uVar6 = 0xfffffff2;
      }
      uVar24 = uVar24 | uVar6;
      local_4a[lVar9] = bVar4;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 7);
    if ((uVar24 == 0) &&
       (CONCAT13(local_4a[6],CONCAT12(local_4a[5],CONCAT11(local_4a[4],local_4a[3]))) == 0x4345525f
        && CONCAT13(local_4a[3],CONCAT12(local_4a[2],CONCAT11(local_4a[1],local_4a[0]))) ==
           0x5f564544)) {
      uVar1 = (bios->dcb).offset;
      uVar6 = uVar1 - 7;
      bios->dev_rec_offset = uVar6;
      bios->odcb_offset = uVar1 - 0x87;
      envy_bios_block(bios,uVar6,7,"DEV_REC",-1);
      envy_bios_block(bios,bios->odcb_offset,0x80,"ODCB",-1);
      uVar25 = local_3c;
      uVar6 = local_40;
    }
    else {
      iVar7 = envy_bios_parse_rdcb(bios);
      uVar25 = local_3c;
      uVar6 = local_40;
      if (iVar7 != 0) {
        envy_bios_parse_dcb_cold_3();
      }
    }
  }
  iVar7 = -0xe;
  if (uVar24 == 0) {
    bVar4 = (bios->dcb).hlen;
    uVar5 = (uint)bVar4;
    if ((int)(uint)bVar4 < (int)uVar6) {
      __format = "DCB table header too short [%d < %d]\n";
      uVar19 = (ulong)uVar5;
    }
    else {
      bVar4 = (bios->dcb).rlen;
      uVar19 = (ulong)bVar4;
      if (uVar25 <= bVar4) {
        if ((int)uVar6 < (int)uVar5) {
          fprintf(_stderr,"DCB table header longer than expected [%d > %d]\n",(ulong)uVar5,
                  (ulong)uVar6);
          uVar19 = (ulong)(bios->dcb).rlen;
        }
        if (uVar25 < (uint)uVar19) {
          fprintf(_stderr,"DCB table record longer than expected [%d > %d]\n",uVar19,(ulong)uVar25);
        }
        bVar4 = (bios->dcb).entriesnum;
        peVar8 = (envy_bios_dcb_entry *)calloc((ulong)bVar4,0x20);
        (bios->dcb).entries = peVar8;
        if (peVar8 == (envy_bios_dcb_entry *)0x0) {
          return -0xc;
        }
        if (bVar4 != 0) {
          uVar19 = 0;
          do {
            peVar3 = (bios->dcb).entries;
            peVar8 = peVar3 + uVar19;
            peVar3[uVar19].offset =
                 (ushort)(bios->dcb).rlen * (short)uVar19 +
                 (ushort)(bios->dcb).hlen + (bios->dcb).offset;
            bVar4 = (bios->dcb).rlen;
            uVar20 = 0;
            do {
              if (bVar4 <= uVar20) break;
              uVar1 = peVar8->offset;
              if (bios->length <= (uint)uVar1 + (int)uVar20) {
                fprintf(_stderr,"requested OOB u8 at 0x%04x\n",(ulong)((int)uVar20 + (uint)uVar1));
                return -0xe;
              }
              local_4a[uVar20] = bios->data[uVar20 + uVar1];
              uVar20 = uVar20 + 1;
            } while (uVar20 != 10);
            bVar4 = (bios->dcb).version;
            if (bVar4 < 0x20) {
              if (0x13 < bVar4) {
                peVar8->type = local_4a[0] & 0xf;
                peVar8->unk00_4 = local_4a[0] >> 4;
                peVar8->i2c = local_4a[2] * '\x04' & 0xf | local_4a[1] >> 6;
                uVar22 = '\x01' << (local_4a[2] >> 2 & 7);
                peVar8->or = uVar22;
                peVar8->heads = uVar22;
                peVar8->loc = local_4a[2] >> 5;
                peVar8->conntag = local_4a[3] >> 1 & 7;
                if ((local_4a[0] & 0xf) == 0) {
                  peVar8->maxfreq = (uint)CONCAT11(local_4a[7],local_4a[6]) * 10;
                }
              }
              goto switchD_002561a4_caseD_1;
            }
            peVar8->type = local_4a[0] & 0xf;
            peVar8->i2c = local_4a[0] >> 4;
            peVar8->heads = local_4a[1] & 0xf;
            (&peVar8->conn)[(ulong)(bVar4 < 0x30) * 2] = local_4a[1] >> 4;
            peVar8->conntag = local_4a[2] & 0xf;
            peVar8->loc = local_4a[2] >> 4 & 3;
            peVar8->unk02_6 = local_4a[2] >> 6;
            peVar8->or = local_4a[3] & 0xf;
            peVar8->unk03_4 = local_4a[3] >> 4;
            peVar8->unk04 = local_4a[4];
            peVar8->unk05 = local_4a[5];
            peVar8->unk06 = local_4a[6];
            peVar8->unk07 = local_4a[7];
            bVar23 = local_4a[4];
            switch(local_4a[0] & 0xf) {
            case 0:
              if (bVar4 < 0x30) {
                peVar8->maxfreq = ((uint)local_4a[5] * 0x200 + (uint)local_4a[4] * 2) * 5;
                peVar8->unk04 = '\0';
                peVar8->unk05 = '\0';
              }
              else {
                peVar8->maxfreq = (uint)local_4a[4] * 10000;
                peVar8->unk04 = '\0';
              }
              break;
            case 2:
              if (0x2f < bVar4) {
                peVar8->ext_addr = local_4a[5];
                peVar8->unk05 = '\0';
                peVar8->tmds_hdmi = local_4a[6] >> 1 & 1;
                bVar21 = local_4a[6] & 0xfd;
                peVar8->unk06 = bVar21;
                goto LAB_002562ec;
              }
              peVar8->ext_addr = local_4a[4] >> 4;
              peVar8->unk04 = local_4a[4] & 0xf;
              break;
            case 3:
              peVar8->lvds_info = local_4a[4] & 3;
              peVar8->lvds_pscript = local_4a[4] >> 2 & 3;
              peVar8->unk04 = local_4a[4] & 0xf0;
              bVar23 = local_4a[4] & 0xf0;
              bVar21 = local_4a[6];
              goto LAB_002562ec;
            case 6:
              peVar8->ext_addr = local_4a[5];
              peVar8->unk05 = '\0';
              peVar8->dp_bw = local_4a[6] >> 5;
              bVar21 = local_4a[6] & 0x1f;
              peVar8->unk06 = bVar21;
              peVar8->dp_lanes = local_4a[7] & 0xf;
              peVar8->unk07 = local_4a[7] & 0xf0;
LAB_002562ec:
              if (0x3f < bVar4) {
                peVar8->unk04 = bVar23 & 0xcf;
                peVar8->links = local_4a[4] >> 4 & 3;
                peVar8->unk06 = bVar21 & 0xfd;
              }
            }
switchD_002561a4_caseD_1:
            uVar19 = uVar19 + 1;
          } while (uVar19 < (bios->dcb).entriesnum);
        }
        (bios->dcb).valid = '\x01';
        iVar7 = envy_bios_parse_i2c(bios);
        if (iVar7 != 0) {
          envy_bios_parse_dcb_cold_4();
        }
        iVar7 = envy_bios_parse_gpio(bios);
        if (iVar7 != 0) {
          envy_bios_parse_dcb_cold_5();
        }
        iVar7 = envy_bios_parse_inputdev(bios);
        if (iVar7 != 0) {
          envy_bios_parse_dcb_cold_6();
        }
        iVar7 = envy_bios_parse_cinema(bios);
        if (iVar7 != 0) {
          envy_bios_parse_dcb_cold_7();
        }
        iVar7 = envy_bios_parse_spreadspectrum(bios);
        if (iVar7 != 0) {
          envy_bios_parse_dcb_cold_8();
        }
        iVar7 = envy_bios_parse_extdev(bios);
        if (iVar7 != 0) {
          envy_bios_parse_dcb_cold_9();
        }
        iVar7 = envy_bios_parse_conn(bios);
        if (iVar7 != 0) {
          envy_bios_parse_dcb_cold_10();
        }
        iVar7 = envy_bios_parse_hdtvtt(bios);
        if (iVar7 != 0) {
          envy_bios_parse_dcb_cold_11();
        }
        iVar7 = envy_bios_parse_mux(bios);
        if (iVar7 != 0) {
          envy_bios_parse_dcb_cold_12();
        }
        return 0;
      }
      __format = "DCB table record too short [%d < %d]\n";
      uVar6 = uVar25;
    }
    fprintf(_stderr,__format,uVar19,(ulong)uVar6);
LAB_00256546:
    iVar7 = -0x16;
  }
  return iVar7;
switchD_00255a8e_caseD_13:
  envy_bios_parse_dcb_cold_13();
  goto LAB_00256546;
}

Assistant:

int envy_bios_parse_dcb (struct envy_bios *bios) {
	struct envy_bios_dcb *dcb = &bios->dcb;
	if (!dcb->offset)
		return 0;
	int err = 0;
	err |= bios_u8(bios, dcb->offset, &dcb->version);
	if (err)
		return -EFAULT;
	int wanthlen, wantrlen;
	uint32_t sig;
	uint8_t defs;
	switch (dcb->version) {
		case 0x10:
		case 0x11:
			/* old useless crap */
			wanthlen = dcb->hlen = 0;
			wantrlen = dcb->rlen = 0;
			dcb->version = 0;
			bios->odcb_offset = dcb->offset;
			dcb->offset = 0;
			return 0;
		case 0x12:
			wanthlen = dcb->hlen = 4;
			dcb->entriesnum = 16;
			wantrlen = dcb->rlen = 8;
			err |= bios_u8(bios, dcb->offset+1, &defs);
			err |= bios_u16(bios, dcb->offset+2, &bios->i2c.offset);
			bios->i2c.def[0] = defs & 0xf;
			bios->i2c.def[1] = defs >> 4;
			bios->odcb_offset = dcb->offset - 0x80;
			envy_bios_block(bios, bios->odcb_offset, 0x80, "ODCB", -1);
			break;
		case 0x14:
		case 0x15:
			wanthlen = dcb->hlen = 4;
			dcb->entriesnum = 16;
			wantrlen = dcb->rlen = 10;
			err |= bios_u8(bios, dcb->offset+1, &defs);
			err |= bios_u16(bios, dcb->offset+2, &bios->i2c.offset);
			bios->i2c.def[0] = defs & 0xf;
			bios->i2c.def[1] = defs >> 4;
			break;
		case 0x22:
		case 0x20:
		case 0x21:
			wanthlen = dcb->hlen = 8;
			dcb->entriesnum = 16;
			wantrlen = dcb->rlen = 8;
			err |= bios_u8(bios, dcb->offset+1, &defs);
			err |= bios_u16(bios, dcb->offset+2, &bios->i2c.offset);
			err |= bios_u32(bios, dcb->offset+4, &sig);
			if (sig != 0x4edcbdcb) {
				ENVY_BIOS_ERR("DCB sig mismatch\n");
				return -EINVAL;
			}
			bios->i2c.def[0] = defs & 0xf;
			bios->i2c.def[1] = defs >> 4;
			break;
		case 0x30:
		case 0x40:
		case 0x41:
			wanthlen = 23;
			wantrlen = 8;
			err |= bios_u8(bios, dcb->offset+1, &dcb->hlen);
			err |= bios_u8(bios, dcb->offset+2, &dcb->entriesnum);
			err |= bios_u8(bios, dcb->offset+3, &dcb->rlen);
			err |= bios_u16(bios, dcb->offset+4, &bios->i2c.offset);
			err |= bios_u32(bios, dcb->offset+6, &sig);
			err |= bios_u16(bios, dcb->offset+10, &bios->gpio.offset);
			err |= bios_u16(bios, dcb->offset+12, &bios->inputdev.offset);
			err |= bios_u16(bios, dcb->offset+14, &bios->cinema.offset);
			err |= bios_u16(bios, dcb->offset+16, &bios->spreadspectrum.offset);
			err |= bios_u16(bios, dcb->offset+18, &bios->extdev.offset);
			err |= bios_u16(bios, dcb->offset+20, &bios->conn.offset);
			err |= bios_u8(bios, dcb->offset+22, &dcb->unk16);
			if (dcb->hlen >= 25) {
				wanthlen = 25;
				err |= bios_u16(bios, dcb->offset+23, &bios->hdtvtt.offset);
			}
			if (dcb->hlen >= 27) {
				wanthlen = 27;
				err |= bios_u16(bios, dcb->offset+25, &bios->mux.offset);
			}
			if (sig != 0x4edcbdcb) {
				ENVY_BIOS_ERR("DCB sig mismatch\n");
				return -EINVAL;
			}
			break;
		default:
			ENVY_BIOS_ERR("Unknown DCB table version %d.%d\n", dcb->version >> 4, dcb->version & 0xf);
			return -EINVAL;
	}
	envy_bios_block(bios, dcb->offset, dcb->hlen + dcb->rlen * dcb->entriesnum, "DCB", -1);
	if (dcb->version >= 0x14 && dcb->version < 0x30) {
		uint8_t dev_rec[7];
		int j;
		for (j = 0; j < 7; j++)
			err |= bios_u8(bios, dcb->offset-7+j, &dev_rec[j]);
		if (!err && !memcmp(dev_rec, "DEV_REC", 7)) {
			bios->dev_rec_offset = dcb->offset - 7;
			bios->odcb_offset = bios->dev_rec_offset - 0x80;
			envy_bios_block(bios, bios->dev_rec_offset, 7, "DEV_REC", -1);
			envy_bios_block(bios, bios->odcb_offset, 0x80, "ODCB", -1);
		} else {
			if (envy_bios_parse_rdcb(bios))
				ENVY_BIOS_ERR("Failed to parse RDCB table at 0x%04x version %d.%d\n", bios->dcb.offset, bios->dcb.rdcb_version >> 4, bios->dcb.rdcb_version & 0xf);
		}
	}
	if (err)
		return -EFAULT;
	if (dcb->hlen < wanthlen) {
		ENVY_BIOS_ERR("DCB table header too short [%d < %d]\n", dcb->hlen, wanthlen);
		return -EINVAL;
	}
	if (dcb->rlen < wantrlen) {
		ENVY_BIOS_ERR("DCB table record too short [%d < %d]\n", dcb->rlen, wantrlen);
		return -EINVAL;
	}
	if (dcb->hlen > wanthlen) {
		ENVY_BIOS_WARN("DCB table header longer than expected [%d > %d]\n", dcb->hlen, wanthlen);
	}
	if (dcb->rlen > wantrlen) {
		ENVY_BIOS_WARN("DCB table record longer than expected [%d > %d]\n", dcb->rlen, wantrlen);
	}
	dcb->entries = calloc(dcb->entriesnum, sizeof *dcb->entries);
	if (!dcb->entries)
		return -ENOMEM;
	int i;
	for (i = 0; i < dcb->entriesnum; i++) {
		struct envy_bios_dcb_entry *entry = &dcb->entries[i];
		entry->offset = dcb->offset + dcb->hlen + dcb->rlen * i;
		uint8_t bytes[10];
		int j;
		for (j = 0; j < 10 && j < dcb->rlen; j++) {
			err |= bios_u8(bios, entry->offset+j, &bytes[j]);
			if (err)
				return -EFAULT;
		}
		if (dcb->version >= 0x20) {
			entry->type = bytes[0] & 0xf;
			entry->i2c = bytes[0] >> 4;
			entry->heads = bytes[1] & 0xf;
			if (dcb->version >= 0x30)
				entry->conn = bytes[1] >> 4;
			else
				entry->unk01_4 = bytes[1] >> 4;
			entry->conntag = bytes[2] & 0xf;
			entry->loc = bytes[2] >> 4 & 3;
			entry->unk02_6 = bytes[2] >> 6;
			entry->or = bytes[3] & 0xf;
			entry->unk03_4 = bytes[3] >> 4; /* seen used once on quadro, not sure if it means something */
			entry->unk04 = bytes[4];
			entry->unk05 = bytes[5];
			entry->unk06 = bytes[6];
			entry->unk07 = bytes[7];
			switch (entry->type) {
				case ENVY_BIOS_DCB_ANALOG:
					if (dcb->version < 0x30) {
						entry->maxfreq = (bytes[4] | bytes[5] << 8) * 10;
						entry->unk04 = 0;
						entry->unk05 = 0;
					} else {
						entry->maxfreq = bytes[4] * 10000;
						entry->unk04 = 0;
					}
					break;
				case ENVY_BIOS_DCB_TMDS:
					if (dcb->version < 0x30) {
						entry->ext_addr = bytes[4] >> 4;
						entry->unk04 &= ~0xf0;
					} else {
						entry->ext_addr = bytes[5];
						entry->unk05 = 0;
						entry->tmds_hdmi = !!(bytes[6] & 2);
						entry->unk06 &= ~2;
					}
					break;
				case ENVY_BIOS_DCB_LVDS:
					entry->lvds_info = bytes[4] & 3;
					entry->lvds_pscript = bytes[4] >> 2 & 3;
					entry->unk04 &= ~0xf;
					break;
				case ENVY_BIOS_DCB_DP:
					entry->ext_addr = bytes[5];
					entry->unk05 = 0;
					entry->dp_bw = bytes[6] >> 5;
					entry->unk06 &= ~0xe0;
					entry->dp_lanes = bytes[7] & 0xf;
					entry->unk07 &= ~0xf;
					break;
				/* XXX: TV */
				default:
					break;
			}
			if ((entry->type == ENVY_BIOS_DCB_LVDS || entry->type == ENVY_BIOS_DCB_TMDS || entry->type == ENVY_BIOS_DCB_DP) && dcb->version >= 0x40) {
				entry->unk04 &= ~0x30;
				entry->links = bytes[4] >> 4 & 3;
				entry->unk06 &= ~2;
			}
		} else if (dcb->version >= 0x14) {
			entry->type = bytes[0] & 0xf;
			entry->unk00_4 = bytes[0] >> 4;
			entry->i2c = (bytes[1] >> 6 & 3) | (bytes[2] << 2 & 0xc);
			entry->heads = entry->or = 1 << (bytes[2] >> 2 & 7);
			entry->loc = (bytes[2] >> 5) | (bytes[3] << 3 & 1);
			entry->conntag = bytes[3] >> 1 & 7;
			if (entry->type == ENVY_BIOS_DCB_ANALOG)
				entry->maxfreq = (bytes[6] | bytes[7] << 8) * 10;
			/* XXX */
		} else {
			/* XXX */
		}
	}
	dcb->valid = 1;
	if (envy_bios_parse_i2c(bios))
		ENVY_BIOS_ERR("Failed to parse I2C table at 0x%04x version %d.%d\n", bios->i2c.offset, bios->i2c.version >> 4, bios->i2c.version & 0xf);
	if (envy_bios_parse_gpio(bios))
		ENVY_BIOS_ERR("Failed to parse GPIO table at 0x%04x version %d.%d\n", bios->gpio.offset, bios->gpio.version >> 4, bios->gpio.version & 0xf);
	if (envy_bios_parse_inputdev(bios))
		ENVY_BIOS_ERR("Failed to parse INPUTDEV table at 0x%04x version %d.%d\n", bios->inputdev.offset, bios->inputdev.version >> 4, bios->inputdev.version & 0xf);
	if (envy_bios_parse_cinema(bios))
		ENVY_BIOS_ERR("Failed to parse CINEMA table at 0x%04x version %d.%d\n", bios->cinema.offset, bios->cinema.version >> 4, bios->cinema.version & 0xf);
	if (envy_bios_parse_spreadspectrum(bios))
		ENVY_BIOS_ERR("Failed to parse SPREADSPECTRUM table at 0x%04x version %d.%d\n", bios->spreadspectrum.offset, bios->spreadspectrum.version >> 4, bios->spreadspectrum.version & 0xf);
	if (envy_bios_parse_extdev(bios))
		ENVY_BIOS_ERR("Failed to parse EXTDEV table at 0x%04x version %d.%d\n", bios->extdev.offset, bios->extdev.version >> 4, bios->extdev.version & 0xf);
	if (envy_bios_parse_conn(bios))
		ENVY_BIOS_ERR("Failed to parse CONN table at 0x%04x version %d.%d\n", bios->conn.offset, bios->conn.version >> 4, bios->conn.version & 0xf);
	if (envy_bios_parse_hdtvtt(bios))
		ENVY_BIOS_ERR("Failed to parse HDTVTT table at 0x%04x version %d.%d\n", bios->hdtvtt.offset, bios->hdtvtt.version >> 4, bios->hdtvtt.version & 0xf);
	if (envy_bios_parse_mux(bios))
		ENVY_BIOS_ERR("Failed to parse MUX table at 0x%04x version %d.%d\n", bios->mux.offset, bios->mux.version >> 4, bios->mux.version & 0xf);
	return 0;
}